

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

bool __thiscall
cmFileListGeneratorGlob::Search(cmFileListGeneratorGlob *this,string *parent,cmFileList *lister)

{
  pointer pcVar1;
  pointer pbVar2;
  bool bVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  pointer inName;
  string expr;
  Glob g;
  string local_a0;
  Glob local_80;
  
  pcVar1 = (parent->_M_dataplus)._M_p;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar1,pcVar1 + parent->_M_string_length);
  std::__cxx11::string::_M_append((char *)&local_a0,(ulong)(this->Pattern)._M_dataplus._M_p);
  cmsys::Glob::Glob(&local_80);
  bVar3 = cmsys::Glob::FindFiles(&local_80,&local_a0,(GlobMessages *)0x0);
  if (bVar3) {
    pvVar4 = cmsys::Glob::GetFiles_abi_cxx11_(&local_80);
    pbVar2 = (pvVar4->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (inName = (pvVar4->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; inName != pbVar2; inName = inName + 1)
    {
      bVar3 = cmsys::SystemTools::FileIsDirectory(inName);
      if (bVar3) {
        bVar3 = cmFileListGeneratorBase::Consider
                          (&this->super_cmFileListGeneratorBase,inName,lister);
        if (bVar3) {
          bVar3 = true;
          goto LAB_001aa95b;
        }
      }
    }
  }
  bVar3 = false;
LAB_001aa95b:
  cmsys::Glob::~Glob(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool Search(std::string const& parent, cmFileList& lister) override
  {
    // Glob the set of matching files.
    std::string expr = parent;
    expr += this->Pattern;
    cmsys::Glob g;
    if (!g.FindFiles(expr)) {
      return false;
    }
    std::vector<std::string> const& files = g.GetFiles();

    // Look for directories among the matches.
    for (std::string const& f : files) {
      if (cmSystemTools::FileIsDirectory(f)) {
        if (this->Consider(f, lister)) {
          return true;
        }
      }
    }
    return false;
  }